

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_error_alert::torrent_error_alert
          (torrent_error_alert *this,stack_allocator *alloc,torrent_handle *h,error_code *e,
          string_view f)

{
  error_category *peVar1;
  string_view str;
  bool bVar2;
  undefined3 uVar3;
  allocation_slot aVar4;
  error_code *e_local;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  torrent_error_alert *this_local;
  string_view f_local;
  
  f_local.ptr_ = (char *)f.len_;
  this_local = (torrent_error_alert *)f.ptr_;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_error_alert_00991528;
  bVar2 = e->failed_;
  uVar3 = *(undefined3 *)&e->field_0x5;
  peVar1 = e->cat_;
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  str.len_ = (size_t)f_local.ptr_;
  str.ptr_ = (char *)this_local;
  aVar4 = libtorrent::aux::stack_allocator::copy_string(alloc,str);
  (this->m_file_idx).m_idx = aVar4.m_idx;
  boost::basic_string_view::operator_cast_to_string
            (&this->error_file,(basic_string_view *)&this_local);
  return;
}

Assistant:

torrent_error_alert::torrent_error_alert(
		aux::stack_allocator& alloc
		, torrent_handle const& h
		, error_code const& e, string_view f)
		: torrent_alert(alloc, h)
		, error(e)
		, m_file_idx(alloc.copy_string(f))
#if TORRENT_ABI_VERSION == 1
		, error_file(f)
#endif
	{}